

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void resizable_cb(Fl_Light_Button *i,void *v)

{
  Fl_Widget *pFVar1;
  Fl_Widget_Type *pFVar2;
  int iVar3;
  bool bVar4;
  
  if ((char *)v != "LOAD") {
    Fl_Widget_Type::resizable(current_widget,(i->super_Fl_Button).value_);
    set_modflag(1);
    return;
  }
  iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
  if ((iVar3 == 0) && (numselected < 2)) {
    Fl_Widget::activate((Fl_Widget *)i);
    pFVar2 = current_widget;
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])(current_widget);
    pFVar1 = pFVar2->o;
    if (iVar3 == 0) {
      if (pFVar1->parent_ == (Fl_Group *)0x0) {
        bVar4 = false;
      }
      else {
        bVar4 = pFVar1->parent_->resizable_ == pFVar1;
      }
    }
    else {
      bVar4 = pFVar1[1].callback_ != (Fl_Callback *)0x0;
    }
    Fl_Button::value(&i->super_Fl_Button,(uint)bVar4);
    return;
  }
  Fl_Widget::deactivate((Fl_Widget *)i);
  return;
}

Assistant:

void resizable_cb(Fl_Light_Button* i,void* v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;}
    if (numselected > 1) {i->deactivate(); return;}
    i->activate();
    i->value(current_widget->resizable());
  } else {
    current_widget->resizable(i->value());
    set_modflag(1);
  }
}